

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode
UA_Server_setObjectTypeNode_lifecycleManagement
          (UA_Server *server,UA_NodeId nodeId,UA_ObjectLifecycleManagement olm)

{
  UA_StatusCode UVar1;
  UA_NodeStoreEntry **ppUVar2;
  UA_Node *pUVar3;
  
  ppUVar2 = findNode(server->nodestore,&nodeId);
  if (ppUVar2 == (UA_NodeStoreEntry **)0x0) {
    pUVar3 = (UA_Node *)0x0;
  }
  else {
    pUVar3 = &(*ppUVar2)->node;
  }
  if (pUVar3 == (UA_Node *)0x0) {
    UVar1 = 0x80340000;
  }
  else {
    UVar1 = 0x805f0000;
    if (pUVar3->nodeClass == UA_NODECLASS_OBJECTTYPE) {
      *(_func_void_ptr_UA_NodeId **)((long)(pUVar3 + 1) + 8) = olm.constructor;
      *(_func_void_UA_NodeId_void_ptr **)((long)(pUVar3 + 1) + 0x10) = olm.destructor;
      UVar1 = 0;
    }
  }
  return UVar1;
}

Assistant:

UA_StatusCode
UA_Server_setObjectTypeNode_lifecycleManagement(UA_Server *server, UA_NodeId nodeId,
                                                UA_ObjectLifecycleManagement olm) {
    UA_RCU_LOCK();
    UA_StatusCode retval = UA_Server_editNode(server, &adminSession, &nodeId,
                                              (UA_EditNodeCallback)setOLM, &olm);
    UA_RCU_UNLOCK();
    return retval;
}